

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void kj::_::waitImpl(OwnPromiseNode *node,ExceptionOrValue *result,WaitScope *waitScope,
                    SourceLocation location)

{
  bool bVar1;
  FiberBase *pFVar2;
  undefined8 uVar3;
  PromiseNode *pPVar4;
  FiberStack *this;
  Type *func;
  long *in_FS_OFFSET;
  Event *local_210;
  Type local_1f8;
  Type local_1e8;
  Type local_1d0;
  undefined1 local_1c8 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2035:5)>
  _kjDefer2035;
  undefined1 local_198 [8];
  RootEvent doneEvent;
  Fault f_3;
  DebugExpression<bool> _kjCondition_3;
  Fault f_2;
  DebugExpression<kj::_::FiberBase::_unnamed_type_1_&> local_120 [8];
  undefined1 local_118 [8];
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition_2;
  Type local_e8;
  undefined1 local_e0 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2013:5)>
  _kjDefer2013;
  Fault f_1;
  DebugExpression<kj::_::FiberBase::_unnamed_type_1_&> local_c0 [8];
  undefined1 local_b8 [8];
  DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
  _kjCondition_1;
  FiberBase *fiber;
  FiberBase *_fiber2002;
  Fault local_68;
  Fault f;
  DebugExpression<kj::EventLoop*> local_58 [8];
  undefined1 local_50 [8];
  DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> _kjCondition;
  EventLoop *loop;
  WaitScope *waitScope_local;
  ExceptionOrValue *result_local;
  OwnPromiseNode *node_local;
  
  f.exception = (Exception *)waitScope->loop;
  _kjCondition._32_8_ = f.exception;
  local_58 = (DebugExpression<kj::EventLoop*>  [8])
             DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&MAGIC_ASSERT,(EventLoop **)&f);
  DebugExpression<kj::EventLoop*>::operator==
            ((DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_50,local_58,
             (EventLoop **)(*in_FS_OFFSET + -0x28));
  bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::EventLoop*,kj::EventLoop*&>&,char_const(&)[37]>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,1999,FAILED,"&loop == threadLocalEventLoop",
               "_kjCondition,\"WaitScope not valid for this thread.\"",
               (DebugComparison<kj::EventLoop_*,_kj::EventLoop_*&> *)local_50,
               (char (*) [37])"WaitScope not valid for this thread.");
    Debug::Fault::fatal(&local_68);
  }
  pFVar2 = readMaybe<kj::_::FiberBase>(&waitScope->fiber);
  if (pFVar2 == (FiberBase *)0x0) {
    f_3.exception._6_1_ = (*(byte *)(_kjCondition._32_8_ + 8) ^ 0xff) & 1;
    f_3.exception._7_1_ =
         DebugExpressionStart::operator<<
                   ((DebugExpressionStart *)&MAGIC_ASSERT,(bool *)((long)&f_3.exception + 6));
    bVar1 = DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f_3.exception + 7));
    if (!bVar1) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51]>
                ((Fault *)&doneEvent.traceAddr,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x7ec,FAILED,"!loop.running",
                 "_kjCondition,\"wait() is not allowed from within event callbacks.\"",
                 (DebugExpression<bool> *)((long)&f_3.exception + 7),
                 (char (*) [51])"wait() is not allowed from within event callbacks.");
      Debug::Fault::fatal((Fault *)&doneEvent.traceAddr);
    }
    pPVar4 = kj::Own::operator_cast_to_PromiseNode_((Own *)node);
    _kjDefer2035.maybeFunc.ptr.field_1 =
         (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2035:5)>_2
          )location.fileName;
    anon_unknown_173::RootEvent::RootEvent((RootEvent *)local_198,pPVar4,waitImpl,location);
    pPVar4 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(node);
    (*(pPVar4->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar4,node);
    pPVar4 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(node);
    (*(pPVar4->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar4,local_198);
    *(undefined1 *)(_kjCondition._32_8_ + 8) = 1;
    local_1d0.loop = (EventLoop *)_kjCondition._32_8_;
    defer<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__1>
              ((kj *)local_1c8,&local_1d0);
    while( true ) {
      local_1e8.doneEvent = (RootEvent *)local_198;
      local_1e8.loop = (EventLoop *)_kjCondition._32_8_;
      func = &local_1e8;
      local_1e8.waitScope = waitScope;
      WaitScope::
      runOnStackPool<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__2>
                (waitScope,func);
      uVar3 = _kjCondition._32_8_;
      if (((byte)doneEvent.super_Event.location.lineNumber & 1) != 0) break;
      EventLoop::wait((EventLoop *)_kjCondition._32_8_,func);
    }
    bVar1 = EventLoop::isRunnable((EventLoop *)_kjCondition._32_8_);
    EventLoop::setRunnable((EventLoop *)uVar3,bVar1);
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:2035:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2035:5)>
                 *)local_1c8);
    anon_unknown_173::RootEvent::~RootEvent((RootEvent *)local_198);
  }
  else {
    if (pFVar2->state == CANCELED) {
      uVar3 = __cxa_allocate_exception(1);
      fiberCanceledException();
      __cxa_throw(uVar3,&CanceledException::typeinfo,0);
    }
    local_c0 = (DebugExpression<kj::_::FiberBase::_unnamed_type_1_&>  [8])
               DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&MAGIC_ASSERT,&pFVar2->state);
    f_1.exception._4_4_ = 1;
    DebugExpression<kj::_::FiberBase::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                *)local_b8,local_c0,(Type *)((long)&f_1.exception + 4));
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&,char_const(&)[66]>
                ((Fault *)&_kjDefer2013.maybeFunc.ptr.field_1.value,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x7d7,FAILED,"fiber.state == FiberBase::RUNNING",
                 "_kjCondition,\"This WaitScope can only be used within the fiber that created it.\""
                 ,(DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                   *)local_b8,
                 (char (*) [66])"This WaitScope can only be used within the fiber that created it.")
      ;
      Debug::Fault::fatal((Fault *)&_kjDefer2013.maybeFunc.ptr.field_1.value);
    }
    pPVar4 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(node);
    (*(pPVar4->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar4,node);
    pPVar4 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(node);
    local_210 = (Event *)0x0;
    if (pFVar2 != (FiberBase *)0x0) {
      local_210 = &pFVar2->super_Event;
    }
    (*(pPVar4->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar4,local_210);
    pFVar2->currentInner = node;
    local_e8.fiber = pFVar2;
    defer<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__0>
              ((kj *)local_e0,&local_e8);
    pFVar2->state = WAITING;
    this = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&pFVar2->stack);
    FiberStack::switchToMain(this);
    if (pFVar2->state == CANCELED) {
      uVar3 = __cxa_allocate_exception(1);
      fiberCanceledException();
      __cxa_throw(uVar3,&CanceledException::typeinfo,0);
    }
    local_120 = (DebugExpression<kj::_::FiberBase::_unnamed_type_1_&>  [8])
                DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&MAGIC_ASSERT,&pFVar2->state);
    f_2.exception._4_4_ = 1;
    DebugExpression<kj::_::FiberBase::{unnamed_type#1}&>::operator==
              ((DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                *)local_118,local_120,(Type *)((long)&f_2.exception + 4));
    bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_118);
    if (!bVar1) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::FiberBase::_unnamed_type_1_&,_unnamed_type_1_>&>
                ((Fault *)&stack0xfffffffffffffed0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
                 ,0x7ea,FAILED,"fiber.state == FiberBase::RUNNING","_kjCondition,",
                 (DebugComparison<kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)_&,_kj::_::FiberBase::(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1348:3)>
                  *)local_118);
      Debug::Fault::fatal((Fault *)&stack0xfffffffffffffed0);
    }
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:2013:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:2013:5)>
                 *)local_e0);
  }
  local_1f8.node = node;
  local_1f8.result = result;
  WaitScope::
  runOnStackPool<kj::_::waitImpl(kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>&&,kj::_::ExceptionOrValue&,kj::WaitScope&,kj::SourceLocation)::__3>
            (waitScope,&local_1f8);
  return;
}

Assistant:

void waitImpl(_::OwnPromiseNode&& node, _::ExceptionOrValue& result, WaitScope& waitScope,
              SourceLocation location) {
  EventLoop& loop = waitScope.loop;
  KJ_REQUIRE(&loop == threadLocalEventLoop, "WaitScope not valid for this thread.");

  // we don't support fibers when running without exceptions, so just remove the whole block
  KJ_IF_SOME(fiber, waitScope.fiber) {
    if (fiber.state == FiberBase::CANCELED) {
      throw fiberCanceledException();
    }
    KJ_REQUIRE(fiber.state == FiberBase::RUNNING,
        "This WaitScope can only be used within the fiber that created it.");

    node->setSelfPointer(&node);
    node->onReady(&fiber);

    fiber.currentInner = &node;
    KJ_DEFER(fiber.currentInner = nullptr);

    // Switch to the main stack to run the event loop.
    fiber.state = FiberBase::WAITING;
    fiber.stack->switchToMain();

    // The main stack switched back to us, meaning either the event we registered with
    // node->onReady() fired, or we are being canceled by FiberBase's destructor.

    if (fiber.state == FiberBase::CANCELED) {
      throw fiberCanceledException();
    }

    KJ_ASSERT(fiber.state == FiberBase::RUNNING);
  } else {
    KJ_REQUIRE(!loop.running, "wait() is not allowed from within event callbacks.");

    RootEvent doneEvent(node, reinterpret_cast<void*>(&waitImpl), location);
    node->setSelfPointer(&node);
    node->onReady(&doneEvent);

    loop.running = true;
    KJ_DEFER(loop.running = false);

    for (;;) {
      waitScope.runOnStackPool([&]() {
        uint counter = 0;
        while (!doneEvent.fired) {
          if (!loop.turn()) {
            // No events in the queue.  Wait for callback.
            return;
          } else if (++counter > waitScope.busyPollInterval) {
            // Note: It's intentional that if busyPollInterval is kj::maxValue, we never poll.
            counter = 0;
            loop.poll();
          }
        }
      });

      if (doneEvent.fired) {
        break;
      } else {
        loop.wait();
      }
    }

    loop.setRunnable(loop.isRunnable());
  }